

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O3

jp2_box_t * jp2_box_create(int type)

{
  jp2_boxinfo_t *pjVar1;
  jp2_boxinfo_t *boxinfo;
  jp2_box_t *pjVar2;
  jp2_boxinfo_t *pjVar3;
  
  pjVar2 = (jp2_box_t *)jas_malloc(0x140);
  if (pjVar2 != (jp2_box_t *)0x0) {
    memset(&pjVar2->datalen,0,0x120);
    pjVar2->type = (long)type;
    pjVar2->len = 0;
    pjVar3 = jp2_boxinfos;
    do {
      if (pjVar3->type == type) goto LAB_00116255;
      pjVar1 = pjVar3 + 1;
      pjVar3 = pjVar3 + 1;
    } while (pjVar1->name != (char *)0x0);
    pjVar3 = &jp2_boxinfo_unk;
LAB_00116255:
    pjVar2->info = pjVar3;
    pjVar2->ops = &pjVar3->ops;
  }
  return pjVar2;
}

Assistant:

jp2_box_t *jp2_box_create(int type)
{
	jp2_box_t *box;
	const jp2_boxinfo_t *boxinfo;
	if (!(box = jp2_box_create0())) {
		return 0;
	}
	box->type = type;
	box->len = 0;
	if (!(boxinfo = jp2_boxinfolookup(type))) {
		return 0;
	}
	box->info = boxinfo;
	box->ops = &boxinfo->ops;
	return box;
}